

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_wrapper.cpp
# Opt level: O0

word_wrapper * __thiscall
pstore::command_line::word_wrapper::operator++
          (word_wrapper *__return_storage_ptr__,word_wrapper *this,int param_1)

{
  int param_1_local;
  word_wrapper *this_local;
  word_wrapper *prev;
  
  word_wrapper(__return_storage_ptr__,this);
  operator++(this);
  return __return_storage_ptr__;
}

Assistant:

word_wrapper word_wrapper::operator++ (int) {
                word_wrapper prev = *this;
                ++(*this);
                return prev;
            }